

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space2.cpp
# Opt level: O2

void drop_bomb_proc(Am_Object param_1)

{
  char cVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Am_Value *pAVar8;
  Am_Object *pAVar9;
  Am_Object alien;
  Am_Object local_60;
  int bomb_top;
  int bomb_left;
  Am_Object new_bomb;
  Am_Object bomb_owner;
  Am_Object local_40;
  Am_Value_List aliens;
  
  uVar4 = rand();
  if ((uVar4 & 0x20) == 0) {
    pAVar8 = (Am_Value *)Am_Object::Get(0x92f0,(ulong)NUM_ALIENS);
    iVar5 = Am_Value::operator_cast_to_int(pAVar8);
    if (iVar5 != 0) {
      iVar6 = rand();
      pAVar8 = (Am_Value *)Am_Object::Get(0x92f0,0x82);
      Am_Value_List::Am_Value_List(&aliens,pAVar8);
      alien.data = (Am_Object_Data *)0x0;
      Am_Value_List::Start();
      iVar5 = (iVar6 >> 4) % iVar5 + 1;
      while( true ) {
        cVar1 = Am_Value_List::Last();
        uVar3 = (ushort)&alien;
        if (cVar1 != '\0') break;
        pAVar8 = (Am_Value *)Am_Value_List::Get();
        Am_Object::operator=(&alien,pAVar8);
        Am_Object::Get(uVar3,0xb0);
        bVar2 = Am_Value::Valid();
        iVar5 = iVar5 - (uint)bVar2;
        if (iVar5 == 0) break;
        Am_Object::operator=(&alien,(Am_Object *)&Am_No_Object);
        Am_Value_List::Next();
      }
      cVar1 = Am_Object::operator==(&alien,(Am_Object *)&Am_No_Object);
      if (cVar1 == '\0') {
        Am_Object::Get_Owner(&bomb_owner,0x1092d0);
        new_bomb.data = (Am_Object_Data *)0x0;
        pAVar8 = (Am_Value *)Am_Object::Get(uVar3,100);
        iVar5 = Am_Value::operator_cast_to_int(pAVar8);
        pAVar8 = (Am_Value *)Am_Object::Get(uVar3,0x66);
        iVar6 = Am_Value::operator_cast_to_int(pAVar8);
        iVar5 = iVar6 / 2 + iVar5;
        bomb_left = iVar5;
        pAVar8 = (Am_Value *)Am_Object::Get(uVar3,0x65);
        iVar6 = Am_Value::operator_cast_to_int(pAVar8);
        pAVar8 = (Am_Value *)Am_Object::Get(uVar3,0x67);
        iVar7 = Am_Value::operator_cast_to_int(pAVar8);
        bomb_top = iVar7 + iVar6;
        Am_Object::Get_Owner(&local_60,(Am_Slot_Flags)&alien);
        Am_Translate_Coordinates(&local_60,iVar5,iVar7 + iVar6,&bomb_owner,&bomb_left,&bomb_top);
        Am_Object::~Am_Object(&local_60);
        Am_Object::Create((char *)&local_60);
        uVar3 = Am_Object::Set((ushort)&local_60,100,(ulong)(uint)bomb_left);
        pAVar9 = (Am_Object *)Am_Object::Set(uVar3,0x65,(ulong)(uint)bomb_top);
        pAVar9 = (Am_Object *)Am_Object::operator=(&new_bomb,pAVar9);
        Am_Object::Am_Object(&local_40,pAVar9);
        Am_Object::Add_Part((Am_Object_Data *)&bomb_owner,SUB81(&local_40,0),1);
        Am_Object::~Am_Object(&local_40);
        Am_Object::~Am_Object(&local_60);
        Am_Object::Set((ushort)&new_bomb,0x65,1000);
        Am_Object::~Am_Object(&new_bomb);
        Am_Object::~Am_Object(&bomb_owner);
      }
      else {
        std::operator<<((ostream *)&std::cout,"Oops.\n");
      }
      Am_Object::~Am_Object(&alien);
      Am_Value_List::~Am_Value_List(&aliens);
    }
  }
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, drop_bomb, (Am_Object /*cmd*/))
{
  // Only drop a bomb 50% of the time we call this, for some variation.
  if (rand() >> 5 & 0x1)
    return; // test one of the middle bits
  int num_aliens = Aliens.Get(NUM_ALIENS);
  if (!num_aliens)
    return; // no one is left to shoot!

  // Not an even distribution, but it'll do.
  int alien_shooting = (rand() >> 4) % num_aliens + 1;
  Am_Value_List aliens = Aliens.Get(Am_GRAPHICAL_PARTS);
  Am_Object alien;
  for (aliens.Start(); !aliens.Last(); aliens.Next()) {
    alien = aliens.Get();
    //    if (alien.Get(Am_LINE_STYLE) != Am_No_Style)  // alien is not dead
    if (alien.Get(Am_IMAGE).Valid())
      alien_shooting--;
    if (alien_shooting)
      alien = Am_No_Object;
    else
      break;
  }
  if (alien == Am_No_Object) {
    cout << "Oops.\n";
    return;
  }
  // now alien contains the alien we're dealing with.
  Am_Object bomb_owner = Ship.Get_Owner();
  Am_Object new_bomb;
  int bomb_left = (int)alien.Get(Am_LEFT) + (int)alien.Get(Am_WIDTH) / 2;
  int bomb_top = (int)alien.Get(Am_TOP) + (int)alien.Get(Am_HEIGHT);
  Am_Translate_Coordinates(alien.Get_Owner(), bomb_left, bomb_top, bomb_owner,
                           bomb_left, bomb_top);
  bomb_owner.Add_Part(new_bomb = Bomb.Create("Live_Bomb")
                                     .Set(Am_LEFT, bomb_left)
                                     .Set(Am_TOP, bomb_top));
  // send the bomb downscreen
  new_bomb.Set(Am_TOP, 1000);
}